

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

int64_t absl::lts_20250127::anon_unknown_1::IDivSlowPath
                  (bool satq,Duration num,Duration den,Duration *rem)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  HiRep HVar4;
  uint uVar5;
  HiRep HVar6;
  HiRep HVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  HiRep HVar11;
  ulong uVar12;
  uint32_t uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  
  uVar9 = den.rep_lo_;
  HVar4 = den.rep_hi_;
  uVar5 = num.rep_lo_;
  HVar7 = num.rep_hi_;
  uVar8 = (ulong)HVar4 ^ (ulong)HVar7;
  if ((uVar5 == 0xffffffff) || (HVar4 == (HiRep)0x0 && uVar9 == 0)) {
    HVar4.lo_ = 0;
    HVar4.hi_ = 0x80000000;
    if (-1 < (long)HVar7) {
      HVar4.lo_ = 0xffffffff;
      HVar4.hi_ = 0x7fffffff;
    }
    rem->rep_hi_ = HVar4;
    rem->rep_lo_ = 0xffffffff;
    if ((long)uVar8 < 0) {
      return -0x8000000000000000;
    }
    return 0x7fffffffffffffff;
  }
  if (uVar9 == 0xffffffff) {
    rem->rep_hi_ = HVar7;
    rem->rep_lo_ = uVar5;
    return 0;
  }
  uVar3 = 4000000000 - uVar5;
  if (-1 < (long)HVar7) {
    uVar3 = uVar5;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)HVar7 >> 0x3f ^ (ulong)HVar7;
  auVar1 = auVar1 * ZEXT816(4000000000) + ZEXT416(uVar3);
  uVar5 = 4000000000 - uVar9;
  if (-1 < (long)HVar4) {
    uVar5 = uVar9;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)HVar4 >> 0x3f ^ (ulong)HVar4;
  auVar2 = auVar2 * ZEXT816(4000000000) + ZEXT416(uVar5);
  auVar15 = __udivti3(auVar1._0_8_,auVar1._8_8_,auVar2._0_8_,auVar2._8_8_);
  HVar4 = auVar15._0_8_;
  HVar6.lo_ = 0;
  HVar6.hi_ = 0x80000000;
  HVar11 = HVar6;
  if (-1 < (long)uVar8) {
    HVar11.lo_ = 0xffffffff;
    HVar11.hi_ = 0x7fffffff;
  }
  uVar10 = 0;
  if (!satq) {
    uVar10 = auVar15._8_8_ & 0x1ffffffff;
    HVar11 = HVar4;
  }
  if (-1 < (long)HVar4 && auVar15._8_8_ == 0) {
    HVar11 = HVar4;
  }
  auVar15._8_8_ = uVar10;
  auVar15._0_4_ = HVar11.lo_;
  auVar15._4_4_ = HVar11.hi_;
  auVar1 = auVar1 - auVar2 * auVar15;
  uVar14 = auVar1._0_8_;
  uVar12 = auVar1._8_8_;
  if (uVar12 == 0) {
    HVar6 = (HiRep)(uVar14 / 4000000000);
  }
  else {
    if (1999999999 < uVar12) {
      if (-1 < (long)HVar7) {
        HVar6.lo_ = 0xffffffff;
        HVar6.hi_ = 0x7fffffff;
      }
      uVar13 = -(uint)(-1 < (long)HVar7 || (uVar14 != 0 || uVar12 != 2000000000));
      goto LAB_010004ec;
    }
    HVar6 = (HiRep)__udivti3(uVar14 & 0xfffffffffffff800,uVar12,4000000000,0);
  }
  uVar13 = auVar1._0_4_ + HVar6.lo_ * 0x1194d800;
  if ((long)HVar7 < 0) {
    if (uVar13 == 0) {
      HVar6 = (HiRep)-(long)HVar6;
      uVar13 = 0;
    }
    else {
      HVar6 = (HiRep)~(ulong)HVar6;
      uVar13 = 4000000000 - uVar13;
    }
  }
LAB_010004ec:
  rem->rep_hi_ = HVar6;
  rem->rep_lo_ = uVar13;
  if (((long)uVar8 < 0) && (uVar10 != 0 || HVar11 != (HiRep)0x0)) {
    uVar8 = -(long)HVar11 | 0x8000000000000000;
  }
  else {
    uVar8 = (ulong)HVar11 & 0x7fffffffffffffff;
  }
  return uVar8;
}

Assistant:

int64_t IDivSlowPath(bool satq, const Duration num, const Duration den,
                     Duration* rem) {
  const bool num_neg = num < ZeroDuration();
  const bool den_neg = den < ZeroDuration();
  const bool quotient_neg = num_neg != den_neg;

  if (time_internal::IsInfiniteDuration(num) || den == ZeroDuration()) {
    *rem = num_neg ? -InfiniteDuration() : InfiniteDuration();
    return quotient_neg ? kint64min : kint64max;
  }
  if (time_internal::IsInfiniteDuration(den)) {
    *rem = num;
    return 0;
  }

  const uint128 a = MakeU128Ticks(num);
  const uint128 b = MakeU128Ticks(den);
  uint128 quotient128 = a / b;

  if (satq) {
    // Limits the quotient to the range of int64_t.
    if (quotient128 > uint128(static_cast<uint64_t>(kint64max))) {
      quotient128 = quotient_neg ? uint128(static_cast<uint64_t>(kint64min))
                                 : uint128(static_cast<uint64_t>(kint64max));
    }
  }

  const uint128 remainder128 = a - quotient128 * b;
  *rem = MakeDurationFromU128(remainder128, num_neg);

  if (!quotient_neg || quotient128 == 0) {
    return Uint128Low64(quotient128) & kint64max;
  }
  // The quotient needs to be negated, but we need to carefully handle
  // quotient128s with the top bit on.
  return -static_cast<int64_t>(Uint128Low64(quotient128 - 1) & kint64max) - 1;
}